

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<long_double>::Subst_Forward
          (TPZSkylMatrix<long_double> *this,TPZFMatrix<long_double> *B)

{
  longdouble lVar1;
  longdouble **pplVar2;
  longdouble *plVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  longdouble *plVar7;
  longdouble *plVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  longdouble lVar13;
  long local_58;
  undefined4 extraout_var_00;
  
  lVar5 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar5 != CONCAT44(extraout_var,iVar4)) ||
     ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<long_double>::Error
              ("virtual int TPZSkylMatrix<long double>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = long double]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar4 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  if (0 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol) {
    lVar9 = 0;
    local_58 = 0;
    do {
      if (lVar5 < 1) {
        lVar12 = 0;
      }
      else {
        lVar10 = 0;
        lVar11 = 0;
        do {
          if (((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar11) ||
             ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar13 = *(longdouble *)
                    ((long)B->fElem +
                    lVar10 + (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * lVar9);
          lVar12 = lVar11;
          if ((lVar13 != (longdouble)0) || (NAN(lVar13) || NAN((longdouble)0))) break;
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + 0x10;
          lVar12 = lVar5;
        } while (lVar5 != lVar11);
      }
      if (lVar12 < lVar5) {
        lVar10 = lVar12 * 0x10 + -0x10;
        do {
          pplVar2 = (this->fElem).fStore;
          plVar3 = pplVar2[lVar12 + 1];
          if (((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar12) ||
             ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar11 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          plVar8 = pplVar2[lVar12] + 1;
          lVar13 = (longdouble)0;
          if (plVar8 < plVar3) {
            plVar7 = (longdouble *)(lVar9 * lVar11 + lVar10 + (long)B->fElem);
            lVar13 = (longdouble)0;
            do {
              lVar13 = *plVar7 * *plVar8 + lVar13;
              plVar8 = plVar8 + 1;
              plVar7 = plVar7 + -1;
            } while (plVar8 < plVar3);
          }
          if ((lVar11 <= lVar12) ||
             ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_58)) {
            TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow * local_58;
          plVar3 = B->fElem;
          lVar1 = plVar3[lVar6 + lVar12];
          plVar3[lVar6 + lVar12] = lVar1 - lVar13;
          lVar11 = lVar12 + 1;
          plVar3[lVar6 + lVar12] = (lVar1 - lVar13) / *(this->fElem).fStore[lVar12];
          lVar10 = lVar10 + 0x10;
          lVar12 = lVar11;
        } while (lVar11 != lVar5);
      }
      local_58 = local_58 + 1;
      lVar9 = lVar9 + 0x10;
    } while (local_58 < (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}